

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O3

REF_STATUS ref_export_ugrid(REF_GRID ref_grid,char *filename)

{
  REF_NODE ref_node;
  REF_DBL *pRVar1;
  REF_CELL pRVar2;
  uint uVar3;
  int iVar4;
  REF_STATUS RVar5;
  FILE *__stream;
  REF_CELL *ppRVar6;
  long lVar7;
  REF_INT RVar8;
  REF_INT RVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  ulong local_e0;
  REF_INT *o2n;
  ulong local_c0;
  REF_INT *n2o;
  REF_INT max_faceid;
  REF_INT min_faceid;
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x5b5,
           "ref_export_ugrid","unable to open file");
    uVar3 = 2;
  }
  else {
    fprintf(__stream,"%d %d %d %d %d %d %d\n",(ulong)(uint)ref_node->n,
            (ulong)(uint)ref_grid->cell[3]->n,(ulong)(uint)ref_grid->cell[6]->n,
            (ulong)(uint)ref_grid->cell[8]->n,(ulong)(uint)ref_grid->cell[9]->n,
            (ulong)(uint)ref_grid->cell[10]->n,(ulong)(uint)ref_grid->cell[0xb]->n);
    uVar3 = ref_node_compact(ref_node,&o2n,&n2o);
    if (uVar3 == 0) {
      if (0 < ref_node->n) {
        lVar12 = 0;
        do {
          pRVar1 = ref_node->real;
          lVar7 = (long)n2o[lVar12];
          fprintf(__stream," %.16e %.16e %.16e\n",pRVar1[lVar7 * 0xf],pRVar1[lVar7 * 0xf + 1],
                  pRVar1[lVar7 * 0xf + 2]);
          lVar12 = lVar12 + 1;
        } while (lVar12 < ref_node->n);
      }
      ref_export_faceid_range(ref_grid,&min_faceid,&max_faceid);
      local_e0 = (ulong)(uint)min_faceid;
      if (min_faceid <= max_faceid) {
        pRVar2 = ref_grid->cell[3];
        uVar3 = pRVar2->node_per;
        RVar9 = pRVar2->max;
        local_c0 = local_e0;
        do {
          iVar4 = (int)local_e0;
          if (0 < RVar9) {
            RVar8 = 0;
            do {
              RVar5 = ref_cell_nodes(pRVar2,RVar8,nodes);
              if ((RVar5 == 0) && (nodes[(int)uVar3] == iVar4)) {
                if (0 < (int)uVar3) {
                  uVar10 = 0;
                  do {
                    fprintf(__stream," %d",(ulong)(o2n[nodes[uVar10]] + 1));
                    uVar10 = uVar10 + 1;
                  } while (uVar3 != uVar10);
                }
                fputc(10,__stream);
              }
              RVar8 = RVar8 + 1;
              RVar9 = pRVar2->max;
            } while (RVar8 < RVar9);
          }
          local_e0 = (ulong)(iVar4 + 1);
        } while (iVar4 != max_faceid);
        if ((int)local_c0 <= max_faceid) {
          pRVar2 = ref_grid->cell[6];
          uVar3 = pRVar2->node_per;
          RVar9 = pRVar2->max;
          local_e0 = local_c0;
          do {
            iVar4 = (int)local_e0;
            if (0 < RVar9) {
              RVar8 = 0;
              do {
                RVar5 = ref_cell_nodes(pRVar2,RVar8,nodes);
                if ((RVar5 == 0) && (nodes[(int)uVar3] == iVar4)) {
                  if (0 < (int)uVar3) {
                    uVar10 = 0;
                    do {
                      fprintf(__stream," %d",(ulong)(o2n[nodes[uVar10]] + 1));
                      uVar10 = uVar10 + 1;
                    } while (uVar3 != uVar10);
                  }
                  fputc(10,__stream);
                }
                RVar8 = RVar8 + 1;
                RVar9 = pRVar2->max;
              } while (RVar8 < RVar9);
            }
            local_e0 = (ulong)(iVar4 + 1);
          } while (iVar4 != max_faceid);
          if ((int)local_c0 <= max_faceid) {
            pRVar2 = ref_grid->cell[3];
            iVar4 = pRVar2->node_per;
            RVar9 = pRVar2->max;
            uVar10 = local_c0;
            do {
              iVar11 = (int)uVar10;
              if (0 < RVar9) {
                RVar8 = 0;
                do {
                  RVar5 = ref_cell_nodes(pRVar2,RVar8,nodes);
                  if ((RVar5 == 0) && (nodes[iVar4] == iVar11)) {
                    fprintf(__stream," %d",(ulong)(uint)nodes[3]);
                    fputc(10,__stream);
                  }
                  RVar8 = RVar8 + 1;
                  RVar9 = pRVar2->max;
                } while (RVar8 < RVar9);
              }
              uVar10 = (ulong)(iVar11 + 1);
            } while (iVar11 != max_faceid);
            if ((int)local_c0 <= max_faceid) {
              pRVar2 = ref_grid->cell[6];
              iVar4 = pRVar2->node_per;
              RVar9 = pRVar2->max;
              uVar10 = local_c0;
              do {
                iVar11 = (int)uVar10;
                if (0 < RVar9) {
                  RVar8 = 0;
                  do {
                    RVar5 = ref_cell_nodes(pRVar2,RVar8,nodes);
                    if ((RVar5 == 0) && (nodes[iVar4] == iVar11)) {
                      fprintf(__stream," %d",(ulong)(uint)nodes[4]);
                      fputc(10,__stream);
                    }
                    RVar8 = RVar8 + 1;
                    RVar9 = pRVar2->max;
                  } while (RVar8 < RVar9);
                }
                uVar10 = (ulong)(iVar11 + 1);
              } while (iVar11 != max_faceid);
            }
          }
        }
      }
      ppRVar6 = ref_grid->cell + 8;
      lVar12 = 8;
      do {
        pRVar2 = *ppRVar6;
        if (0 < pRVar2->max) {
          uVar3 = pRVar2->node_per;
          RVar9 = 0;
          do {
            RVar5 = ref_cell_nodes(pRVar2,RVar9,nodes);
            if (RVar5 == 0) {
              if (0 < (int)uVar3) {
                uVar10 = 0;
                do {
                  fprintf(__stream," %d",(ulong)(o2n[nodes[uVar10]] + 1));
                  uVar10 = uVar10 + 1;
                } while (uVar3 != uVar10);
              }
              fputc(10,__stream);
            }
            RVar9 = RVar9 + 1;
          } while (RVar9 < pRVar2->max);
        }
        ppRVar6 = ref_grid->cell + lVar12 + 1;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x10);
      if (n2o != (REF_INT *)0x0) {
        free(n2o);
      }
      if (o2n != (REF_INT *)0x0) {
        free(o2n);
      }
      fclose(__stream);
      uVar3 = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x5c4,"ref_export_ugrid",(ulong)uVar3,"compact");
    }
  }
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_export_ugrid(REF_GRID ref_grid,
                                           const char *filename) {
  FILE *file;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT *o2n, *n2o;
  REF_INT nnode, ntri, nqua, ntet, npyr, npri, nhex;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node_per, cell;
  REF_INT group;
  REF_INT faceid, min_faceid, max_faceid;

  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  nnode = ref_node_n(ref_node);

  ntri = ref_cell_n(ref_grid_tri(ref_grid));
  nqua = ref_cell_n(ref_grid_qua(ref_grid));

  ntet = ref_cell_n(ref_grid_tet(ref_grid));
  npyr = ref_cell_n(ref_grid_pyr(ref_grid));
  npri = ref_cell_n(ref_grid_pri(ref_grid));
  nhex = ref_cell_n(ref_grid_hex(ref_grid));

  fprintf(file, "%d %d %d %d %d %d %d\n", nnode, ntri, nqua, ntet, npyr, npri,
          nhex);

  RSS(ref_node_compact(ref_node, &o2n, &n2o), "compact");

  for (node = 0; node < ref_node_n(ref_node); node++)
    fprintf(file, " %.16e %.16e %.16e\n", ref_node_xyz(ref_node, 0, n2o[node]),
            ref_node_xyz(ref_node, 1, n2o[node]),
            ref_node_xyz(ref_node, 2, n2o[node]));

  RSS(ref_export_faceid_range(ref_grid, &min_faceid, &max_faceid), "range");

  ref_cell = ref_grid_tri(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  for (faceid = min_faceid; faceid <= max_faceid; faceid++)
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[node_per] == faceid) {
        for (node = 0; node < node_per; node++)
          fprintf(file, " %d", o2n[nodes[node]] + 1);
        fprintf(file, "\n");
      }
    }

  ref_cell = ref_grid_qua(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  for (faceid = min_faceid; faceid <= max_faceid; faceid++)
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[node_per] == faceid) {
        for (node = 0; node < node_per; node++)
          fprintf(file, " %d", o2n[nodes[node]] + 1);
        fprintf(file, "\n");
      }
    }

  ref_cell = ref_grid_tri(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[node_per] == faceid) {
        fprintf(file, " %d", nodes[3]);
        fprintf(file, "\n");
      }
    }
  }

  ref_cell = ref_grid_qua(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[node_per] == faceid) {
        fprintf(file, " %d", nodes[4]);
        fprintf(file, "\n");
      }
    }
  }

  each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
    node_per = ref_cell_node_per(ref_cell);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      for (node = 0; node < node_per; node++)
        fprintf(file, " %d", o2n[nodes[node]] + 1);
      fprintf(file, "\n");
    }
  }

  ref_free(n2o);
  ref_free(o2n);

  fclose(file);

  return REF_SUCCESS;
}